

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O1

int __thiscall
gmath::OrthoCamera::clone
          (OrthoCamera *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  double dVar4;
  OrthoCamera *this_00;
  long lVar5;
  
  this_00 = (OrthoCamera *)operator_new(0xd0);
  OrthoCamera(this_00);
  std::__cxx11::string::_M_assign((string *)&(this_00->super_Camera).name);
  lVar5 = (this->super_Camera).height;
  (this_00->super_Camera).width = (this->super_Camera).width;
  (this_00->super_Camera).height = lVar5;
  lVar5 = 0x38;
  do {
    *(undefined8 *)((long)((this_00->super_Camera).R.v + -2) + 8 + lVar5) =
         *(undefined8 *)((long)((this->super_Camera).R.v + -2) + 8 + lVar5);
    puVar1 = (undefined8 *)((long)((this->super_Camera).R.v + -3) + 0x10 + lVar5);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)((this_00->super_Camera).R.v + -3) + 0x10 + lVar5);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x80);
  (this_00->super_Camera).T.v[2] = (this->super_Camera).T.v[2];
  dVar4 = (this->super_Camera).T.v[1];
  (this_00->super_Camera).T.v[0] = (this->super_Camera).T.v[0];
  (this_00->super_Camera).T.v[1] = dVar4;
  dVar4 = (this->super_Camera).zmax;
  (this_00->super_Camera).zmin = (this->super_Camera).zmin;
  (this_00->super_Camera).zmax = dVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this_00->super_Camera).match,&(this->super_Camera).match);
  dVar4 = this->dres;
  this_00->res = this->res;
  this_00->dres = dVar4;
  return (int)this_00;
}

Assistant:

Camera *OrthoCamera::clone() const
{
  OrthoCamera *ret=new OrthoCamera();

  *ret=*this;

  return ret;
}